

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  bool bVar7;
  xmlChar *cur;
  unsigned_long cons;
  int id;
  int nameNr;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  do {
    bVar7 = false;
    if (*ctxt->input->cur != '\0') {
      bVar7 = ctxt->instate != XML_PARSER_EOF;
    }
    if (!bVar7) {
      return;
    }
    iVar2 = ctxt->input->id;
    uVar3 = ctxt->input->consumed;
    pxVar4 = ctxt->input->cur;
    pxVar5 = ctxt->input->base;
    pxVar6 = ctxt->input->cur;
    if ((*pxVar6 == '<') && (pxVar6[1] == '?')) {
      xmlParsePI(ctxt);
    }
    else if (((*ctxt->input->cur == '<') &&
             ((((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '[')) &&
               (ctxt->input->cur[3] == 'C')) &&
              ((ctxt->input->cur[4] == 'D' && (ctxt->input->cur[5] == 'A')))))) &&
            ((ctxt->input->cur[6] == 'T' &&
             ((ctxt->input->cur[7] == 'A' && (ctxt->input->cur[8] == '[')))))) {
      xmlParseCDSect(ctxt);
    }
    else if ((*pxVar6 == '<') &&
            (((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '-')) &&
             (ctxt->input->cur[3] == '-')))) {
      xmlParseComment(ctxt);
      ctxt->instate = XML_PARSER_CONTENT;
    }
    else if (*pxVar6 == '<') {
      if (ctxt->input->cur[1] == '/') {
        if (ctxt->nameNr <= iVar1) {
          return;
        }
        xmlParseElementEnd(ctxt);
      }
      else {
        xmlParseElementStart(ctxt);
      }
    }
    else if (*pxVar6 == '&') {
      xmlParseReference(ctxt);
    }
    else {
      xmlParseCharData(ctxt,0);
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  } while ((pxVar4 + (uVar3 - (long)pxVar5) !=
            ctxt->input->cur + (ctxt->input->consumed - (long)ctxt->input->base)) ||
          (iVar2 != ctxt->input->id));
  xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
  xmlHaltParser(ctxt);
  return;
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    GROW;
    while ((RAW != 0) &&
	   (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	    ctxt->instate = XML_PARSER_CONTENT;
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= nameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharData(ctxt, 0);
	}

	GROW;
	SHRINK;

	if ((cons == CUR_CONSUMED) && (id == ctxt->input->id)) {
	    xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	                "detected an error in element content\n");
	    xmlHaltParser(ctxt);
            break;
	}
    }
}